

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>
::val(FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>
      *this)

{
  value_type vVar1;
  value_type vVar2;
  
  vVar1 = FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
          ::val(&this->left_->fadexpr_);
  vVar2 = FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
          ::val(&this->right_->fadexpr_);
  return vVar2 + vVar1;
}

Assistant:

const value_type val() const {return left_.val() + right_.val();}